

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getobjtypetag(HSQOBJECT *o,SQUserPointer *typetag)

{
  SQObjectType SVar1;
  SQUserPointer *typetag_local;
  HSQOBJECT *o_local;
  
  SVar1 = o->_type;
  if (SVar1 == OT_CLASS) {
    *typetag = ((o->_unVal).pClass)->_typetag;
  }
  else if (SVar1 == OT_USERDATA) {
    *typetag = (SQUserPointer)((o->_unVal).pTable)->_numofnodes;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return -1;
    }
    *typetag = ((o->_unVal).pClass)->_base->_typetag;
  }
  return 0;
}

Assistant:

SQRESULT sq_getobjtypetag(const HSQOBJECT *o,SQUserPointer * typetag)
{
  switch(sq_type(*o)) {
    case OT_INSTANCE: *typetag = _instance(*o)->_class->_typetag; break;
    case OT_USERDATA: *typetag = _userdata(*o)->_typetag; break;
    case OT_CLASS:    *typetag = _class(*o)->_typetag; break;
    default: return SQ_ERROR;
  }
  return SQ_OK;
}